

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

void pythonUnparsedEntityDecl
               (void *user_data,xmlChar *name,xmlChar *publicId,xmlChar *systemId,
               xmlChar *notationName)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  
  iVar1 = PyObject_HasAttrString(user_data,"unparsedEntityDecl");
  if (iVar1 != 0) {
    plVar2 = (long *)_PyObject_CallMethod_SizeT
                               (user_data,"unparsedEntityDecl","ssss",name,publicId,systemId,
                                notationName);
    lVar3 = PyErr_Occurred();
    if (lVar3 != 0) {
      PyErr_Print();
    }
    if ((plVar2 != (long *)0x0) && (*plVar2 = *plVar2 + -1, *plVar2 == 0)) {
      _Py_Dealloc(plVar2);
      return;
    }
  }
  return;
}

Assistant:

static void
pythonUnparsedEntityDecl(void *user_data,
                         const xmlChar * name,
                         const xmlChar * publicId,
                         const xmlChar * systemId,
                         const xmlChar * notationName)
{
    PyObject *handler;
    PyObject *result;

    handler = (PyObject *) user_data;
    if (PyObject_HasAttrString(handler, (char *) "unparsedEntityDecl")) {
        result =
            PyObject_CallMethod(handler, (char *) "unparsedEntityDecl",
                                (char *) "ssss", name, publicId, systemId,
                                notationName);
        if (PyErr_Occurred())
            PyErr_Print();
        Py_XDECREF(result);
    }
}